

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolormap.cpp
# Opt level: O0

QColor __thiscall QColormap::colorAt(QColormap *this,uint pixel)

{
  long lVar1;
  QColor QVar2;
  QRgb in_ESI;
  QColor *in_RDI;
  long in_FS_OFFSET;
  int blue_mask;
  int green_mask;
  int red_mask;
  int green_shift;
  int red_shift;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(*(long *)in_RDI + 4) == 0) {
    if (*(int *)(*(long *)in_RDI + 8) == 0x10) {
      in_ESI = qt_conv16ToRgb((ushort)((ulong)in_RDI >> 0x30));
    }
    QColor::QColor(in_RDI,in_ESI,0x10,8,0xff0000);
  }
  else {
    QColor::QColor((QColor *)0x48f5b8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2._8_8_ = local_10;
    QVar2._0_8_ = local_18;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

const QColor QColormap::colorAt(uint pixel) const
{
    if (d->mode == Direct) {
        if (d->depth == 16) {
            pixel = qt_conv16ToRgb(pixel);
        }
        const int red_shift = 16;
        const int green_shift = 8;
        const int red_mask   = 0xff0000;
        const int green_mask = 0x00ff00;
        const int blue_mask  = 0x0000ff;
        return QColor((pixel & red_mask) >> red_shift,
                      (pixel & green_mask) >> green_shift,
                      (pixel & blue_mask));
    }
#if 0 // XXX
    Q_ASSERT_X(int(pixel) < qt_screen->numCols(), "QColormap::colorAt", "pixel out of bounds of palette");
    return QColor(qt_screen->clut()[pixel]);
#endif
    return QColor();
}